

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateRowDelete
               (Parse *pParse,Table *pTab,Trigger *pTrigger,int iDataCur,int iIdxCur,int iPk,i16 nPk
               ,u8 count,u8 onconf,u8 eMode,int iIdxNoSeek)

{
  Vdbe *v_00;
  byte bVar1;
  int p2;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  int iVar5;
  byte local_51;
  int iStack_4c;
  u8 p5;
  int addrStart;
  int iCol;
  u32 mask;
  int iStack_3c;
  u8 opSeek;
  int iLabel;
  int iOld;
  Vdbe *v;
  int iPk_local;
  int iIdxCur_local;
  int iDataCur_local;
  Trigger *pTrigger_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  iStack_3c = 0;
  p2 = sqlite3VdbeMakeLabel(v_00);
  bVar1 = 0x1d;
  if ((pTab->tabFlags & 0x20) == 0) {
    bVar1 = 0x20;
  }
  if (eMode == '\0') {
    sqlite3VdbeAddOp4Int(v_00,(uint)bVar1,iDataCur,p2,iPk,(int)nPk);
  }
  iVar2 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
  if ((iVar2 != 0) || (pTrigger != (Trigger *)0x0)) {
    uVar3 = sqlite3TriggerColmask(pParse,pTrigger,(ExprList *)0x0,0,3,pTab,(uint)onconf);
    uVar4 = sqlite3FkOldmask(pParse,pTab);
    iStack_3c = pParse->nMem + 1;
    pParse->nMem = pTab->nCol + 1 + pParse->nMem;
    sqlite3VdbeAddOp2(v_00,0x40,iPk,iStack_3c);
    for (iStack_4c = 0; iStack_4c < pTab->nCol; iStack_4c = iStack_4c + 1) {
      if (((uVar4 | uVar3) == 0xffffffff) ||
         ((iStack_4c < 0x20 && (((uVar4 | uVar3) & 1 << ((byte)iStack_4c & 0x1f)) != 0)))) {
        sqlite3ExprCodeGetColumnOfTable(v_00,pTab,iDataCur,iStack_4c,iStack_3c + iStack_4c + 1);
      }
    }
    iVar2 = sqlite3VdbeCurrentAddr(v_00);
    sqlite3CodeRowTrigger(pParse,pTrigger,0x6d,(ExprList *)0x0,1,pTab,iStack_3c,(uint)onconf,p2);
    iVar5 = sqlite3VdbeCurrentAddr(v_00);
    if (iVar2 < iVar5) {
      sqlite3VdbeAddOp4Int(v_00,(uint)bVar1,iDataCur,p2,iPk,(int)nPk);
      iIdxNoSeek = -1;
    }
    sqlite3FkCheck(pParse,pTab,iStack_3c,0,(int *)0x0,0);
  }
  if (pTab->pSelect == (Select *)0x0) {
    local_51 = 0;
    sqlite3GenerateRowIndexDelete(pParse,pTab,iDataCur,iIdxCur,(int *)0x0,iIdxNoSeek);
    sqlite3VdbeAddOp2(v_00,0x76,iDataCur,(uint)(count != '\0'));
    if (pParse->nested == '\0') {
      sqlite3VdbeAppendP4(v_00,pTab,-6);
    }
    if (eMode != '\0') {
      sqlite3VdbeChangeP5(v_00,4);
    }
    if ((-1 < iIdxNoSeek) && (iIdxNoSeek != iDataCur)) {
      sqlite3VdbeAddOp1(v_00,0x76,iIdxNoSeek);
    }
    if (eMode == '\x02') {
      local_51 = 2;
    }
    sqlite3VdbeChangeP5(v_00,(ushort)local_51);
  }
  sqlite3FkActions(pParse,pTab,(ExprList *)0x0,iStack_3c,(int *)0x0,0);
  sqlite3CodeRowTrigger(pParse,pTrigger,0x6d,(ExprList *)0x0,2,pTab,iStack_3c,(uint)onconf,p2);
  sqlite3VdbeResolveLabel(v_00,p2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowDelete(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the row to be deleted */
  Trigger *pTrigger, /* List of triggers to (potentially) fire */
  int iDataCur,      /* Cursor from which column data is extracted */
  int iIdxCur,       /* First index cursor */
  int iPk,           /* First memory cell containing the PRIMARY KEY */
  i16 nPk,           /* Number of PRIMARY KEY memory cells */
  u8 count,          /* If non-zero, increment the row change counter */
  u8 onconf,         /* Default ON CONFLICT policy for triggers */
  u8 eMode,          /* ONEPASS_OFF, _SINGLE, or _MULTI.  See above */
  int iIdxNoSeek     /* Cursor number of cursor that does not need seeking */
){
  Vdbe *v = pParse->pVdbe;        /* Vdbe */
  int iOld = 0;                   /* First register in OLD.* array */
  int iLabel;                     /* Label resolved to end of generated code */
  u8 opSeek;                      /* Seek opcode */

  /* Vdbe is guaranteed to have been allocated by this stage. */
  assert( v );
  VdbeModuleComment((v, "BEGIN: GenRowDel(%d,%d,%d,%d)",
                         iDataCur, iIdxCur, iPk, (int)nPk));

  /* Seek cursor iCur to the row to delete. If this row no longer exists 
  ** (this can happen if a trigger program has already deleted it), do
  ** not attempt to delete it or fire any DELETE triggers.  */
  iLabel = sqlite3VdbeMakeLabel(v);
  opSeek = HasRowid(pTab) ? OP_NotExists : OP_NotFound;
  if( eMode==ONEPASS_OFF ){
    sqlite3VdbeAddOp4Int(v, opSeek, iDataCur, iLabel, iPk, nPk);
    VdbeCoverageIf(v, opSeek==OP_NotExists);
    VdbeCoverageIf(v, opSeek==OP_NotFound);
  }
 
  /* If there are any triggers to fire, allocate a range of registers to
  ** use for the old.* references in the triggers.  */
  if( sqlite3FkRequired(pParse, pTab, 0, 0) || pTrigger ){
    u32 mask;                     /* Mask of OLD.* columns in use */
    int iCol;                     /* Iterator used while populating OLD.* */
    int addrStart;                /* Start of BEFORE trigger programs */

    /* TODO: Could use temporary registers here. Also could attempt to
    ** avoid copying the contents of the rowid register.  */
    mask = sqlite3TriggerColmask(
        pParse, pTrigger, 0, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onconf
    );
    mask |= sqlite3FkOldmask(pParse, pTab);
    iOld = pParse->nMem+1;
    pParse->nMem += (1 + pTab->nCol);

    /* Populate the OLD.* pseudo-table register array. These values will be 
    ** used by any BEFORE and AFTER triggers that exist.  */
    sqlite3VdbeAddOp2(v, OP_Copy, iPk, iOld);
    for(iCol=0; iCol<pTab->nCol; iCol++){
      testcase( mask!=0xffffffff && iCol==31 );
      testcase( mask!=0xffffffff && iCol==32 );
      if( mask==0xffffffff || (iCol<=31 && (mask & MASKBIT32(iCol))!=0) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iDataCur, iCol, iOld+iCol+1);
      }
    }

    /* Invoke BEFORE DELETE trigger programs. */
    addrStart = sqlite3VdbeCurrentAddr(v);
    sqlite3CodeRowTrigger(pParse, pTrigger, 
        TK_DELETE, 0, TRIGGER_BEFORE, pTab, iOld, onconf, iLabel
    );

    /* If any BEFORE triggers were coded, then seek the cursor to the 
    ** row to be deleted again. It may be that the BEFORE triggers moved
    ** the cursor or already deleted the row that the cursor was
    ** pointing to.
    **
    ** Also disable the iIdxNoSeek optimization since the BEFORE trigger
    ** may have moved that cursor.
    */
    if( addrStart<sqlite3VdbeCurrentAddr(v) ){
      sqlite3VdbeAddOp4Int(v, opSeek, iDataCur, iLabel, iPk, nPk);
      VdbeCoverageIf(v, opSeek==OP_NotExists);
      VdbeCoverageIf(v, opSeek==OP_NotFound);
      testcase( iIdxNoSeek>=0 );
      iIdxNoSeek = -1;
    }

    /* Do FK processing. This call checks that any FK constraints that
    ** refer to this table (i.e. constraints attached to other tables) 
    ** are not violated by deleting this row.  */
    sqlite3FkCheck(pParse, pTab, iOld, 0, 0, 0);
  }

  /* Delete the index and table entries. Skip this step if pTab is really
  ** a view (in which case the only effect of the DELETE statement is to
  ** fire the INSTEAD OF triggers).  
  **
  ** If variable 'count' is non-zero, then this OP_Delete instruction should
  ** invoke the update-hook. The pre-update-hook, on the other hand should
  ** be invoked unless table pTab is a system table. The difference is that
  ** the update-hook is not invoked for rows removed by REPLACE, but the 
  ** pre-update-hook is.
  */ 
  if( pTab->pSelect==0 ){
    u8 p5 = 0;
    sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur,0,iIdxNoSeek);
    sqlite3VdbeAddOp2(v, OP_Delete, iDataCur, (count?OPFLAG_NCHANGE:0));
    if( pParse->nested==0 ){
      sqlite3VdbeAppendP4(v, (char*)pTab, P4_TABLE);
    }
    if( eMode!=ONEPASS_OFF ){
      sqlite3VdbeChangeP5(v, OPFLAG_AUXDELETE);
    }
    if( iIdxNoSeek>=0 && iIdxNoSeek!=iDataCur ){
      sqlite3VdbeAddOp1(v, OP_Delete, iIdxNoSeek);
    }
    if( eMode==ONEPASS_MULTI ) p5 |= OPFLAG_SAVEPOSITION;
    sqlite3VdbeChangeP5(v, p5);
  }

  /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
  ** handle rows (possibly in other tables) that refer via a foreign key
  ** to the row just deleted. */ 
  sqlite3FkActions(pParse, pTab, 0, iOld, 0, 0);

  /* Invoke AFTER DELETE trigger programs. */
  sqlite3CodeRowTrigger(pParse, pTrigger, 
      TK_DELETE, 0, TRIGGER_AFTER, pTab, iOld, onconf, iLabel
  );

  /* Jump here if the row had already been deleted before any BEFORE
  ** trigger programs were invoked. Or if a trigger program throws a 
  ** RAISE(IGNORE) exception.  */
  sqlite3VdbeResolveLabel(v, iLabel);
  VdbeModuleComment((v, "END: GenRowDel()"));
}